

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
absl::StrSplit<std::__cxx11::string>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,absl *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text,char delim,
          function<bool_(absl::string_view)> *predicate)

{
  string_view __args;
  string_view __args_00;
  bool bVar1;
  long lVar2;
  long lVar3;
  undefined7 in_register_00000009;
  undefined1 auStack_88 [8];
  string_view view;
  undefined1 auStack_50 [8];
  string_view view_1;
  size_type end;
  size_type begin;
  function<bool_(absl::string_view)> *predicate_local;
  char delim_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *elems;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  end = 0;
  while (view_1.length_ = std::__cxx11::string::find((char)this,(ulong)(uint)(int)(char)text),
        view_1.length_ != 0xffffffffffffffff) {
    lVar2 = std::__cxx11::string::data();
    string_view::string_view((string_view *)auStack_50,(char *)(lVar2 + end),view_1.length_ - end);
    view.length_ = (size_type)auStack_50;
    __args_00.length_ = (size_type)view_1.ptr_;
    __args_00.ptr_ = (char *)auStack_50;
    bVar1 = std::function<bool_(absl::string_view)>::operator()
                      ((function<bool_(absl::string_view)> *)CONCAT71(in_register_00000009,delim),
                       __args_00);
    if (bVar1) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<absl::string_view&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,(string_view *)auStack_50);
    }
    end = view_1.length_ + 1;
  }
  lVar2 = std::__cxx11::string::data();
  lVar3 = std::__cxx11::string::size();
  string_view::string_view((string_view *)auStack_88,(char *)(lVar2 + end),lVar3 - end);
  __args.length_ = (size_type)view.ptr_;
  __args.ptr_ = (char *)auStack_88;
  bVar1 = std::function<bool_(absl::string_view)>::operator()
                    ((function<bool_(absl::string_view)> *)CONCAT71(in_register_00000009,delim),
                     __args);
  if (bVar1) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<absl::string_view&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,(string_view *)auStack_88);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<String> StrSplit(String const& text, char const delim,
                        function<bool(string_view)> predicate) {
  vector<String> elems;
  typename String::size_type begin = 0;
  typename String::size_type end;
  while ((end = text.find(delim, begin)) != String::npos) {
    string_view view(text.data() + begin, end - begin);
    if (predicate(view))
      elems.emplace_back(view);
    begin = end + 1;
  }
  // Try to add the portion after the last delim.
  string_view view(text.data() + begin, text.size() - begin);
  if (predicate(view))
    elems.emplace_back(view);
  return elems;
}